

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateInlineAccessorDefinitions
          (MapFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline const ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n$classname$::_internal_$name$() const {\n  return $name$_.GetMap();\n}\ninline const ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n$classname$::$name$() const {\n$annotate_get$  // @@protoc_insertion_point(field_map:$full_name$)\n  return _internal_$name$();\n}\ninline ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n$classname$::_internal_mutable_$name$() {\n  return $name$_.MutableMap();\n}\ninline ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n$classname$::mutable_$name$() {\n$annotate_mutable$  // @@protoc_insertion_point(field_mutable_map:$full_name$)\n  return _internal_mutable_$name$();\n}\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MapFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline const ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n"
      "$classname$::_internal_$name$() const {\n"
      "  return $name$_.GetMap();\n"
      "}\n"
      "inline const ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n"
      "$classname$::$name$() const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_map:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n"
      "inline ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n"
      "$classname$::_internal_mutable_$name$() {\n"
      "  return $name$_.MutableMap();\n"
      "}\n"
      "inline ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n"
      "$classname$::mutable_$name$() {\n"
      "$annotate_mutable$"
      "  // @@protoc_insertion_point(field_mutable_map:$full_name$)\n"
      "  return _internal_mutable_$name$();\n"
      "}\n");
}